

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TransformFeedback::Varying::Varying
          (Varying *this,char *name_,VarType *type_,Interpolation interp_)

{
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_19);
  glu::VarType::VarType(&this->type,type_);
  this->interpolation = interp_;
  return;
}

Assistant:

Varying				(const char* name_, const glu::VarType& type_, Interpolation interp_)
							: name			(name_)
							, type			(type_)
							, interpolation	(interp_)
						{
						}